

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_inv_txfm_ssse3.c
# Opt level: O0

void iidentity_row_8xn_ssse3
               (__m128i *out,int32_t *input,int stride,int shift,int height,int txw_idx,
               int rect_type)

{
  undefined2 uVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  short sVar14;
  int in_ECX;
  int in_EDX;
  int32_t *in_RSI;
  long in_RDI;
  int in_R8D;
  int in_R9D;
  undefined8 extraout_XMM0_Qa;
  undefined8 extraout_XMM0_Qa_00;
  undefined8 extraout_XMM0_Qb;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined8 extraout_XMM0_Qb_00;
  int in_stack_00000008;
  __m128i hi_1;
  __m128i lo_1;
  __m128i src_1;
  int i_1;
  __m128i rect_scale;
  __m128i hi;
  __m128i lo;
  __m128i src;
  int i;
  __m128i scale_rounding;
  __m128i one;
  __m128i rounding;
  __m128i scale;
  int32_t *input_row;
  undefined8 local_388;
  undefined8 uStack_380;
  undefined8 local_378;
  undefined8 uStack_370;
  int local_34c;
  undefined8 local_338;
  undefined8 uStack_330;
  undefined8 local_328;
  undefined8 uStack_320;
  int local_2fc;
  int32_t *local_2b8;
  char local_2a8;
  undefined2 local_258;
  undefined2 uStack_256;
  undefined2 uStack_254;
  undefined2 uStack_252;
  undefined2 local_238;
  undefined2 uStack_236;
  undefined2 uStack_234;
  undefined2 uStack_232;
  undefined2 uStack_1f0;
  undefined2 uStack_1ee;
  undefined2 uStack_1ec;
  undefined2 uStack_1ea;
  undefined2 uStack_1d0;
  undefined2 uStack_1ce;
  undefined2 uStack_1cc;
  undefined2 uStack_1ca;
  int local_138;
  int iStack_134;
  int iStack_130;
  int iStack_12c;
  int local_118;
  int iStack_114;
  int iStack_110;
  int iStack_10c;
  int local_f8;
  int iStack_f4;
  int iStack_f0;
  int iStack_ec;
  int local_d8;
  int iStack_d4;
  int iStack_d0;
  int iStack_cc;
  
  uVar1 = (undefined2)NewSqrt2list[in_R9D];
  local_2a8 = (char)in_ECX;
  sVar14 = (short)(1 << (0xbU - local_2a8 & 0x1f)) + 0x800;
  local_2b8 = in_RSI;
  if ((in_stack_00000008 == 1) || (in_stack_00000008 == -1)) {
    for (local_34c = 0; local_34c < in_R8D; local_34c = local_34c + 1) {
      load_32bit_to_16bit(local_2b8);
      auVar16._8_8_ = extraout_XMM0_Qb_00;
      auVar16._0_8_ = extraout_XMM0_Qa_00;
      auVar15._8_8_ = 0x5a805a805a805a80;
      auVar15._0_8_ = 0x5a805a805a805a80;
      auVar15 = pmulhrsw(auVar16,auVar15);
      local_2b8 = local_2b8 + in_EDX;
      local_258 = auVar15._0_2_;
      uStack_256 = auVar15._2_2_;
      uStack_254 = auVar15._4_2_;
      uStack_252 = auVar15._6_2_;
      local_378._0_4_ = CONCAT22(1,local_258);
      local_378._0_6_ = CONCAT24(uStack_256,(undefined4)local_378);
      local_378 = CONCAT26(1,(undefined6)local_378);
      uStack_370._0_2_ = uStack_254;
      uStack_370._2_2_ = 1;
      uStack_370._4_2_ = uStack_252;
      uStack_370._6_2_ = 1;
      uStack_1f0 = auVar15._8_2_;
      uStack_1ee = auVar15._10_2_;
      uStack_1ec = auVar15._12_2_;
      uStack_1ea = auVar15._14_2_;
      local_388._0_4_ = CONCAT22(1,uStack_1f0);
      local_388._0_6_ = CONCAT24(uStack_1ee,(undefined4)local_388);
      local_388 = CONCAT26(1,(undefined6)local_388);
      uStack_380._0_2_ = uStack_1ec;
      uStack_380._2_2_ = 1;
      uStack_380._4_2_ = uStack_1ea;
      uStack_380._6_2_ = 1;
      auVar4._2_2_ = sVar14;
      auVar4._0_2_ = uVar1;
      auVar4._4_2_ = uVar1;
      auVar4._6_2_ = sVar14;
      auVar4._10_2_ = sVar14;
      auVar4._8_2_ = uVar1;
      auVar4._12_2_ = uVar1;
      auVar4._14_2_ = sVar14;
      auVar5._8_8_ = uStack_370;
      auVar5._0_8_ = local_378;
      auVar15 = pmaddwd(auVar5,auVar4);
      auVar2._2_2_ = sVar14;
      auVar2._0_2_ = uVar1;
      auVar2._4_2_ = uVar1;
      auVar2._6_2_ = sVar14;
      auVar2._10_2_ = sVar14;
      auVar2._8_2_ = uVar1;
      auVar2._12_2_ = uVar1;
      auVar2._14_2_ = sVar14;
      auVar3._8_8_ = uStack_380;
      auVar3._0_8_ = local_388;
      auVar16 = pmaddwd(auVar3,auVar2);
      local_118 = auVar15._0_4_;
      iStack_114 = auVar15._4_4_;
      iStack_110 = auVar15._8_4_;
      iStack_10c = auVar15._12_4_;
      auVar15 = ZEXT416(0xc - in_ECX);
      local_378 = CONCAT44(iStack_114 >> auVar15,local_118 >> auVar15);
      uStack_370._0_4_ = iStack_110 >> auVar15;
      uStack_370._4_4_ = iStack_10c >> auVar15;
      local_138 = auVar16._0_4_;
      iStack_134 = auVar16._4_4_;
      iStack_130 = auVar16._8_4_;
      iStack_12c = auVar16._12_4_;
      auVar15 = ZEXT416(0xc - in_ECX);
      local_388 = CONCAT44(iStack_134 >> auVar15,local_138 >> auVar15);
      uStack_380._0_4_ = iStack_130 >> auVar15;
      uStack_380._4_4_ = iStack_12c >> auVar15;
      auVar11._8_8_ = uStack_370;
      auVar11._0_8_ = local_378;
      auVar10._8_8_ = uStack_380;
      auVar10._0_8_ = local_388;
      auVar15 = packssdw(auVar11,auVar10);
      *(undefined1 (*) [16])(in_RDI + (long)local_34c * 0x10) = auVar15;
    }
  }
  else {
    for (local_2fc = 0; local_2fc < in_R8D; local_2fc = local_2fc + 1) {
      load_32bit_to_16bit(local_2b8);
      local_2b8 = local_2b8 + in_EDX;
      local_238 = (undefined2)extraout_XMM0_Qa;
      uStack_236 = (undefined2)((ulong)extraout_XMM0_Qa >> 0x10);
      uStack_234 = (undefined2)((ulong)extraout_XMM0_Qa >> 0x20);
      uStack_232 = (undefined2)((ulong)extraout_XMM0_Qa >> 0x30);
      local_328._0_4_ = CONCAT22(1,local_238);
      local_328._0_6_ = CONCAT24(uStack_236,(undefined4)local_328);
      local_328 = CONCAT26(1,(undefined6)local_328);
      uStack_320._0_2_ = uStack_234;
      uStack_320._2_2_ = 1;
      uStack_320._4_2_ = uStack_232;
      uStack_320._6_2_ = 1;
      uStack_1d0 = (undefined2)extraout_XMM0_Qb;
      uStack_1ce = (undefined2)((ulong)extraout_XMM0_Qb >> 0x10);
      uStack_1cc = (undefined2)((ulong)extraout_XMM0_Qb >> 0x20);
      uStack_1ca = (undefined2)((ulong)extraout_XMM0_Qb >> 0x30);
      local_338._0_4_ = CONCAT22(1,uStack_1d0);
      local_338._0_6_ = CONCAT24(uStack_1ce,(undefined4)local_338);
      local_338 = CONCAT26(1,(undefined6)local_338);
      uStack_330._0_2_ = uStack_1cc;
      uStack_330._2_2_ = 1;
      uStack_330._4_2_ = uStack_1ca;
      uStack_330._6_2_ = 1;
      auVar8._2_2_ = sVar14;
      auVar8._0_2_ = uVar1;
      auVar8._4_2_ = uVar1;
      auVar8._6_2_ = sVar14;
      auVar8._10_2_ = sVar14;
      auVar8._8_2_ = uVar1;
      auVar8._12_2_ = uVar1;
      auVar8._14_2_ = sVar14;
      auVar9._8_8_ = uStack_320;
      auVar9._0_8_ = local_328;
      auVar15 = pmaddwd(auVar9,auVar8);
      auVar6._2_2_ = sVar14;
      auVar6._0_2_ = uVar1;
      auVar6._4_2_ = uVar1;
      auVar6._6_2_ = sVar14;
      auVar6._10_2_ = sVar14;
      auVar6._8_2_ = uVar1;
      auVar6._12_2_ = uVar1;
      auVar6._14_2_ = sVar14;
      auVar7._8_8_ = uStack_330;
      auVar7._0_8_ = local_338;
      auVar16 = pmaddwd(auVar7,auVar6);
      local_d8 = auVar15._0_4_;
      iStack_d4 = auVar15._4_4_;
      iStack_d0 = auVar15._8_4_;
      iStack_cc = auVar15._12_4_;
      auVar15 = ZEXT416(0xc - in_ECX);
      local_328 = CONCAT44(iStack_d4 >> auVar15,local_d8 >> auVar15);
      uStack_320._0_4_ = iStack_d0 >> auVar15;
      uStack_320._4_4_ = iStack_cc >> auVar15;
      local_f8 = auVar16._0_4_;
      iStack_f4 = auVar16._4_4_;
      iStack_f0 = auVar16._8_4_;
      iStack_ec = auVar16._12_4_;
      auVar15 = ZEXT416(0xc - in_ECX);
      local_338 = CONCAT44(iStack_f4 >> auVar15,local_f8 >> auVar15);
      uStack_330._0_4_ = iStack_f0 >> auVar15;
      uStack_330._4_4_ = iStack_ec >> auVar15;
      auVar13._8_8_ = uStack_320;
      auVar13._0_8_ = local_328;
      auVar12._8_8_ = uStack_330;
      auVar12._0_8_ = local_338;
      auVar15 = packssdw(auVar13,auVar12);
      *(undefined1 (*) [16])(in_RDI + (long)local_2fc * 0x10) = auVar15;
    }
  }
  return;
}

Assistant:

static inline void iidentity_row_8xn_ssse3(__m128i *out, const int32_t *input,
                                           int stride, int shift, int height,
                                           int txw_idx, int rect_type) {
  const int32_t *input_row = input;
  const __m128i scale = _mm_set1_epi16(NewSqrt2list[txw_idx]);
  const __m128i rounding = _mm_set1_epi16((1 << (NewSqrt2Bits - 1)) +
                                          (1 << (NewSqrt2Bits - shift - 1)));
  const __m128i one = _mm_set1_epi16(1);
  const __m128i scale_rounding = _mm_unpacklo_epi16(scale, rounding);
  if (rect_type != 1 && rect_type != -1) {
    for (int i = 0; i < height; ++i) {
      const __m128i src = load_32bit_to_16bit(input_row);
      input_row += stride;
      __m128i lo = _mm_unpacklo_epi16(src, one);
      __m128i hi = _mm_unpackhi_epi16(src, one);
      lo = _mm_madd_epi16(lo, scale_rounding);
      hi = _mm_madd_epi16(hi, scale_rounding);
      lo = _mm_srai_epi32(lo, NewSqrt2Bits - shift);
      hi = _mm_srai_epi32(hi, NewSqrt2Bits - shift);
      out[i] = _mm_packs_epi32(lo, hi);
    }
  } else {
    const __m128i rect_scale =
        _mm_set1_epi16(NewInvSqrt2 << (15 - NewSqrt2Bits));
    for (int i = 0; i < height; ++i) {
      __m128i src = load_32bit_to_16bit(input_row);
      src = _mm_mulhrs_epi16(src, rect_scale);
      input_row += stride;
      __m128i lo = _mm_unpacklo_epi16(src, one);
      __m128i hi = _mm_unpackhi_epi16(src, one);
      lo = _mm_madd_epi16(lo, scale_rounding);
      hi = _mm_madd_epi16(hi, scale_rounding);
      lo = _mm_srai_epi32(lo, NewSqrt2Bits - shift);
      hi = _mm_srai_epi32(hi, NewSqrt2Bits - shift);
      out[i] = _mm_packs_epi32(lo, hi);
    }
  }
}